

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expected.hpp
# Opt level: O1

type __thiscall
nonstd::expected_lite::expected<void,_char>::swap<char>
          (expected<void,_char> *this,expected<void,_char> *other)

{
  bool bVar1;
  anon_union_1_2_26c77401_for_storage_t_impl<void,_char>_2 aVar2;
  expected<void,_char> *peVar3;
  
  do {
    peVar3 = other;
    bVar1 = (this->contained).super_storage_t_impl<void,_char>.m_has_value;
    if (bVar1 == false) {
      if ((peVar3->contained).super_storage_t_impl<void,_char>.m_has_value == false) {
        aVar2 = (this->contained).super_storage_t_impl<void,_char>.field_0;
        (this->contained).super_storage_t_impl<void,_char>.field_0 =
             (peVar3->contained).super_storage_t_impl<void,_char>.field_0;
        (peVar3->contained).super_storage_t_impl<void,_char>.field_0 = aVar2;
        return;
      }
    }
    else {
      if ((peVar3->contained).super_storage_t_impl<void,_char>.m_has_value == false) {
        (this->contained).super_storage_t_impl<void,_char>.field_0 =
             (peVar3->contained).super_storage_t_impl<void,_char>.field_0;
        bVar1 = (peVar3->contained).super_storage_t_impl<void,_char>.m_has_value;
        (peVar3->contained).super_storage_t_impl<void,_char>.m_has_value = true;
        (this->contained).super_storage_t_impl<void,_char>.m_has_value = bVar1;
        return;
      }
      if (bVar1 != false) {
        return;
      }
    }
    other = this;
    this = peVar3;
    if ((peVar3->contained).super_storage_t_impl<void,_char>.m_has_value == false) {
      return;
    }
  } while( true );
}

Assistant:

swap( expected & other ) noexcept
    (
        std::is_nothrow_move_constructible<E>::value && std17::is_nothrow_swappable<E&>::value
    )
    {
        using std::swap;

        if      ( ! bool(*this) && ! bool(other) ) { swap( contained.error(), other.contained.error() ); }
        else if (   bool(*this) && ! bool(other) ) { contained.construct_error( std::move( other.error() ) );
                                                     bool has_value = contained.has_value();
                                                     bool other_has_value = other.has_value();
                                                     other.contained.set_has_value(has_value);
                                                     contained.set_has_value(other_has_value);
                                                     }
        else if ( ! bool(*this) &&   bool(other) ) { other.swap( *this ); }
    }